

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int mbedtls_ecp_group_load(mbedtls_ecp_group *grp,mbedtls_ecp_group_id id)

{
  mbedtls_mpi *pmVar1;
  int iVar2;
  size_t sVar3;
  mbedtls_mpi_uint *pmVar4;
  size_t sVar5;
  mbedtls_mpi_uint *pmVar6;
  size_t alen;
  mbedtls_mpi_uint *pmVar7;
  mbedtls_mpi_uint *pmVar8;
  mbedtls_mpi_uint *pmVar9;
  mbedtls_mpi_uint *gx;
  size_t blen;
  mbedtls_mpi local_30;
  
  mbedtls_ecp_group_free(grp);
  grp->id = id;
  switch(id) {
  case MBEDTLS_ECP_DP_SECP192R1:
    grp->modp = ecp_mod_p192;
    sVar3 = 0x18;
    pmVar7 = secp192r1_n;
    pmVar8 = secp192r1_gy;
    pmVar9 = secp192r1_gx;
    pmVar4 = secp192r1_p;
    pmVar6 = secp192r1_b;
    sVar5 = 0x18;
    break;
  case MBEDTLS_ECP_DP_SECP224R1:
    grp->modp = ecp_mod_p224;
    pmVar7 = secp224r1_n;
    pmVar8 = secp224r1_gy;
    pmVar9 = secp224r1_gx;
    pmVar4 = secp224r1_p;
    pmVar6 = secp224r1_b;
    goto LAB_0012536e;
  case MBEDTLS_ECP_DP_SECP256R1:
    grp->modp = ecp_mod_p256;
    pmVar7 = secp256r1_n;
    pmVar8 = secp256r1_gy;
    pmVar9 = secp256r1_gx;
    pmVar4 = secp256r1_p;
    pmVar6 = secp256r1_b;
LAB_0012536e:
    sVar3 = 0x20;
    sVar5 = 0x20;
    break;
  case MBEDTLS_ECP_DP_SECP384R1:
    grp->modp = ecp_mod_p384;
    sVar3 = 0x30;
    pmVar7 = secp384r1_n;
    pmVar8 = secp384r1_gy;
    pmVar9 = secp384r1_gx;
    pmVar4 = secp384r1_p;
    pmVar6 = secp384r1_b;
    sVar5 = 0x30;
    break;
  case MBEDTLS_ECP_DP_SECP521R1:
    grp->modp = ecp_mod_p521;
    sVar3 = 0x48;
    pmVar7 = secp521r1_n;
    pmVar8 = secp521r1_gy;
    pmVar9 = secp521r1_gx;
    pmVar4 = secp521r1_p;
    pmVar6 = secp521r1_b;
    sVar5 = 0x48;
    break;
  case MBEDTLS_ECP_DP_BP256R1:
    blen = 0x20;
    pmVar8 = brainpoolP256r1_n;
    pmVar9 = brainpoolP256r1_gy;
    gx = brainpoolP256r1_gx;
    pmVar6 = brainpoolP256r1_p;
    pmVar4 = brainpoolP256r1_a;
    pmVar7 = brainpoolP256r1_b;
    sVar5 = 0x20;
    alen = 0x20;
    sVar3 = blen;
    goto LAB_0012548e;
  case MBEDTLS_ECP_DP_BP384R1:
    blen = 0x30;
    pmVar8 = brainpoolP384r1_n;
    pmVar9 = brainpoolP384r1_gy;
    gx = brainpoolP384r1_gx;
    pmVar6 = brainpoolP384r1_p;
    pmVar4 = brainpoolP384r1_a;
    pmVar7 = brainpoolP384r1_b;
    sVar5 = 0x30;
    alen = 0x30;
    sVar3 = blen;
    goto LAB_0012548e;
  case MBEDTLS_ECP_DP_BP512R1:
    blen = 0x40;
    pmVar8 = brainpoolP512r1_n;
    pmVar9 = brainpoolP512r1_gy;
    gx = brainpoolP512r1_gx;
    pmVar6 = brainpoolP512r1_p;
    pmVar4 = brainpoolP512r1_a;
    pmVar7 = brainpoolP512r1_b;
    sVar5 = 0x40;
    alen = 0x40;
    sVar3 = blen;
    goto LAB_0012548e;
  case MBEDTLS_ECP_DP_CURVE25519:
    grp->modp = ecp_mod_p255;
    iVar2 = mbedtls_mpi_read_string(&grp->A,0x10,"01DB42");
    if (iVar2 == 0) {
      pmVar1 = &grp->P;
      iVar2 = mbedtls_mpi_lset(pmVar1,1);
      if (((iVar2 == 0) && (iVar2 = mbedtls_mpi_shift_l(pmVar1,0xff), iVar2 == 0)) &&
         (iVar2 = mbedtls_mpi_sub_int(pmVar1,pmVar1,0x13), iVar2 == 0)) {
        sVar3 = mbedtls_mpi_bitlen(pmVar1);
        grp->pbits = sVar3;
        iVar2 = mbedtls_mpi_read_string(&grp->N,0x10,"14DEF9DEA2F79CD65812631A5CF5D3ED");
        if (((iVar2 == 0) && (iVar2 = mbedtls_mpi_set_bit(&grp->N,0xfc,'\x01'), iVar2 == 0)) &&
           ((iVar2 = mbedtls_mpi_lset(&(grp->G).X,9), iVar2 == 0 &&
            (iVar2 = mbedtls_mpi_lset(&(grp->G).Z,1), iVar2 == 0)))) {
          mbedtls_mpi_free(&(grp->G).Y);
          grp->nbits = 0xfe;
          return 0;
        }
      }
    }
    goto LAB_00125576;
  case MBEDTLS_ECP_DP_SECP192K1:
    grp->modp = ecp_mod_p192k1;
    sVar3 = 0x18;
    pmVar8 = secp192k1_n;
    pmVar9 = secp192k1_gy;
    gx = secp192k1_gx;
    pmVar6 = secp192k1_p;
    pmVar4 = secp192k1_a;
    pmVar7 = secp192k1_b;
    sVar5 = 0x18;
    goto LAB_0012547a;
  case MBEDTLS_ECP_DP_SECP224K1:
    grp->modp = ecp_mod_p224k1;
    pmVar8 = secp224k1_n;
    pmVar9 = secp224k1_gy;
    gx = secp224k1_gx;
    pmVar6 = secp224k1_p;
    pmVar4 = secp224k1_a;
    pmVar7 = secp224k1_b;
    goto LAB_00125475;
  case MBEDTLS_ECP_DP_SECP256K1:
    grp->modp = ecp_mod_p256k1;
    pmVar8 = secp256k1_n;
    pmVar9 = secp256k1_gy;
    gx = secp256k1_gx;
    pmVar6 = secp256k1_p;
    pmVar4 = secp256k1_a;
    pmVar7 = secp256k1_b;
LAB_00125475:
    sVar3 = 0x20;
    sVar5 = 0x20;
LAB_0012547a:
    alen = 8;
    blen = 8;
LAB_0012548e:
    ecp_group_load(grp,pmVar6,sVar5,pmVar4,alen,pmVar7,blen,gx,sVar3,pmVar9,sVar3,pmVar8,sVar3);
    return 0;
  case MBEDTLS_ECP_DP_CURVE448:
    grp->modp = ecp_mod_p448;
    mbedtls_mpi_init(&local_30);
    iVar2 = mbedtls_mpi_read_string(&grp->A,0x10,"98AA");
    if (iVar2 == 0) {
      pmVar1 = &grp->P;
      iVar2 = mbedtls_mpi_lset(pmVar1,1);
      if ((((iVar2 == 0) && (iVar2 = mbedtls_mpi_shift_l(pmVar1,0xe0), iVar2 == 0)) &&
          (iVar2 = mbedtls_mpi_sub_int(pmVar1,pmVar1,1), iVar2 == 0)) &&
         ((iVar2 = mbedtls_mpi_shift_l(pmVar1,0xe0), iVar2 == 0 &&
          (iVar2 = mbedtls_mpi_sub_int(pmVar1,pmVar1,1), iVar2 == 0)))) {
        sVar3 = mbedtls_mpi_bitlen(pmVar1);
        grp->pbits = sVar3;
        iVar2 = mbedtls_mpi_lset(&(grp->G).X,5);
        if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_lset(&(grp->G).Z,1), iVar2 == 0)) {
          mbedtls_mpi_free(&(grp->G).Y);
          pmVar1 = &grp->N;
          iVar2 = mbedtls_mpi_set_bit(pmVar1,0x1be,'\x01');
          if (((iVar2 == 0) &&
              (iVar2 = mbedtls_mpi_read_string
                                 (&local_30,0x10,
                                  "8335DC163BB124B65129C96FDE933D8D723A70AADC873D6D54A7BB0D"),
              iVar2 == 0)) && (iVar2 = mbedtls_mpi_sub_mpi(pmVar1,pmVar1,&local_30), iVar2 == 0)) {
            grp->nbits = 0x1bf;
            mbedtls_mpi_free(&local_30);
            return 0;
          }
        }
      }
    }
    mbedtls_mpi_free(&local_30);
LAB_00125576:
    mbedtls_ecp_group_free(grp);
    return iVar2;
  default:
    grp->id = MBEDTLS_ECP_DP_NONE;
    return -0x4e80;
  }
  ecp_group_load(grp,pmVar4,sVar5,(mbedtls_mpi_uint *)0x0,0,pmVar6,sVar3,pmVar9,sVar3,pmVar8,sVar3,
                 pmVar7,sVar3);
  return 0;
}

Assistant:

int mbedtls_ecp_group_load( mbedtls_ecp_group *grp, mbedtls_ecp_group_id id )
{
    ECP_VALIDATE_RET( grp != NULL );
    mbedtls_ecp_group_free( grp );

    grp->id = id;

    switch( id )
    {
#if defined(MBEDTLS_ECP_DP_SECP192R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192R1:
            NIST_MODP( p192 );
            return( LOAD_GROUP( secp192r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224R1:
            NIST_MODP( p224 );
            return( LOAD_GROUP( secp224r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256R1:
            NIST_MODP( p256 );
            return( LOAD_GROUP( secp256r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP384R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP384R1:
            NIST_MODP( p384 );
            return( LOAD_GROUP( secp384r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP521R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP521R1:
            NIST_MODP( p521 );
            return( LOAD_GROUP( secp521r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP521R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP192K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192K1:
            grp->modp = ecp_mod_p192k1;
            return( LOAD_GROUP_A( secp192k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224K1:
            grp->modp = ecp_mod_p224k1;
            return( LOAD_GROUP_A( secp224k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256K1:
            grp->modp = ecp_mod_p256k1;
            return( LOAD_GROUP_A( secp256k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP256R1_ENABLED)
        case MBEDTLS_ECP_DP_BP256R1:
            return( LOAD_GROUP_A( brainpoolP256r1 ) );
#endif /* MBEDTLS_ECP_DP_BP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP384R1_ENABLED)
        case MBEDTLS_ECP_DP_BP384R1:
            return( LOAD_GROUP_A( brainpoolP384r1 ) );
#endif /* MBEDTLS_ECP_DP_BP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP512R1_ENABLED)
        case MBEDTLS_ECP_DP_BP512R1:
            return( LOAD_GROUP_A( brainpoolP512r1 ) );
#endif /* MBEDTLS_ECP_DP_BP512R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_CURVE25519_ENABLED)
        case MBEDTLS_ECP_DP_CURVE25519:
            grp->modp = ecp_mod_p255;
            return( ecp_use_curve25519( grp ) );
#endif /* MBEDTLS_ECP_DP_CURVE25519_ENABLED */

#if defined(MBEDTLS_ECP_DP_CURVE448_ENABLED)
        case MBEDTLS_ECP_DP_CURVE448:
            grp->modp = ecp_mod_p448;
            return( ecp_use_curve448( grp ) );
#endif /* MBEDTLS_ECP_DP_CURVE448_ENABLED */

        default:
            grp->id = MBEDTLS_ECP_DP_NONE;
            return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );
    }
}